

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

void gmlc::networking::AsioContextManager::closeContext(string *contextName)

{
  iterator __position;
  bool bVar1;
  lock_guard<std::mutex> nullLock;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  iterator fnd;
  unique_lock<std::mutex> ctxlock;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
  *in_stack_ffffffffffffff78;
  unique_lock<std::mutex> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  unique_lock<std::mutex> local_48;
  _Self local_38 [3];
  _Self local_20 [4];
  
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff80,(mutex_type *)in_stack_ffffffffffffff78);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x7070a4);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(local_20,local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>
                  *)0x7070ea);
    std::shared_ptr<gmlc::networking::AsioContextManager>::shared_ptr
              ((shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_ffffffffffffff80,
               (shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_ffffffffffffff78);
    __position._M_node._7_1_ = in_stack_ffffffffffffff8f;
    __position._M_node._0_7_ = in_stack_ffffffffffffff88;
    std::
    map<std::__cxx11::string,std::shared_ptr<gmlc::networking::AsioContextManager>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>>
    ::erase_abi_cxx11_((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                        *)in_stack_ffffffffffffff80,__position);
    std::unique_lock<std::mutex>::unlock(in_stack_ffffffffffffff80);
    std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x70713d);
    bVar1 = isRunning((AsioContextManager *)0x707145);
    if (bVar1) {
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x707162);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,
                 (mutex_type *)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff80 = &local_48;
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x707184);
      std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::reset
                ((unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *
                 )in_stack_ffffffffffffff80,(pointer)in_stack_ffffffffffffff78);
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x70719e);
      std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator->
                ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)0x7071aa);
      asio::io_context::stop((io_context *)0x7071b2);
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x7071be);
      std::shared_future<void>::get((shared_future<void> *)0x7071cd);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x7071d9);
    }
    else {
      std::
      __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x707222);
      bVar1 = std::__basic_future<void>::valid((__basic_future<void> *)0x707231);
      if (bVar1) {
        std::
        __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x707241);
        std::shared_future<void>::get((shared_future<void> *)0x707250);
      }
    }
    std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
              ((shared_ptr<gmlc::networking::AsioContextManager> *)0x707260);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff80);
  return;
}

Assistant:

void AsioContextManager::closeContext(const std::string& contextName)
{
    std::unique_lock<std::mutex> ctxlock(contextLock);
    auto fnd = contexts.find(contextName);
    //    std::cout << "closing context manager\n";
    if (fnd != contexts.end()) {
        auto ptr = fnd->second;
        contexts.erase(fnd);
        ctxlock.unlock();
        if (ptr->isRunning()) {
            std::lock_guard<std::mutex> nullLock(ptr->runningLoopLock);
            ptr->nullwork.reset();
            ptr->ictx->stop();
            ptr->loopRet.get();
        } else if (ptr->loopRet.valid()) {
            ptr->loopRet.get();
        }
    }
}